

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::loopback(TestMembraneImpl *this,LoopbackContext context)

{
  Reader local_c0;
  Client local_90 [2];
  Maybe<capnp::MessageSize> local_60;
  Builder local_48;
  CallContextHook *local_20;
  TestMembraneImpl *this_local;
  LoopbackContext context_local;
  
  local_20 = context.hook;
  context_local.hook = (CallContextHook *)this;
  kj::Maybe<capnp::MessageSize>::Maybe();
  CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::getResults(&local_48,
               (CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
                *)&this_local,&local_60);
  CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::getParams(&local_c0,
              (CallContext<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
               *)&this_local);
  capnproto_test::capnp::test::TestMembrane::LoopbackParams::Reader::getThing(local_90,&local_c0);
  capnproto_test::capnp::test::TestMembrane::LoopbackResults::Builder::setThing(&local_48,local_90);
  capnproto_test::capnp::test::TestMembrane::Thing::Client::~Client(local_90);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_60);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> loopback(LoopbackContext context) override {
    context.getResults().setThing(context.getParams().getThing());
    return kj::READY_NOW;
  }